

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O1

void GetBinaryPathWithFileNameA(char *path,size_t buffer_size,char *filename)

{
  long lVar1;
  char *pcVar2;
  long lVar3;
  uchar *puVar4;
  ulong uVar5;
  size_t __n;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  ulong uVar9;
  char *pcVar10;
  char local_368 [8];
  char modulename [260];
  char local_258 [8];
  char fullpath [260];
  uchar local_148 [8];
  char dir [256];
  char local_33 [8];
  char drive [3];
  
  PlatformAgnostic::SystemInfo::GetBinaryLocation(local_368,0x104);
  uVar9 = (ulong)(local_368[3] == '\\' &&
                 (local_368[2] == '?' && (local_368[1] == '\\' && local_368[0] == '\\')));
  cVar8 = local_368[uVar9 * 4];
  pcVar10 = local_368 + uVar9 * 4;
  if (pcVar10[cVar8 != '\0'] == ':') {
    strncpy_s(local_33,3,pcVar10,2);
    pcVar10 = (char *)(((ulong)(cVar8 != '\0') | (ulong)pcVar10) + 1);
  }
  else {
    local_33[0] = '\0';
    local_33[1] = -3;
    local_33[2] = -3;
  }
  pcVar2 = (char *)0x0;
  pcVar7 = pcVar10;
  do {
    do {
      pcVar6 = pcVar2;
      pcVar2 = pcVar7 + 1;
      cVar8 = *pcVar7;
      pcVar7 = pcVar2;
    } while (cVar8 == '/');
  } while ((cVar8 == '\\') || (pcVar2 = pcVar6, cVar8 != '\0'));
  if (pcVar6 == (char *)0x0) {
    local_148[0] = '\0';
    memset(local_148 + 1,0xfd,0xff);
  }
  else if ((ulong)((long)pcVar6 - (long)pcVar10) < 0x100) {
    strncpy_s((char *)local_148,0x100,pcVar10,(long)pcVar6 - (long)pcVar10);
  }
  else {
    local_33[0] = '\0';
    local_33[1] = -3;
    local_33[2] = -3;
    local_148[0] = '\0';
    memset(local_148 + 1,0xfd,0xff);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  if (local_33[0] == '\0') {
    pcVar10 = local_258;
    uVar9 = 0;
  }
  else {
    pcVar10 = local_258 + 2;
    local_258[0] = local_33[0];
    local_258[1] = 0x3a;
    uVar9 = 2;
  }
  uVar5 = uVar9;
  pcVar7 = pcVar10;
  if (local_148[0] == '\0') {
LAB_0010df0c:
    if ((filename != (char *)0x0) && (cVar8 = *filename, cVar8 != '\0')) {
      pcVar10 = filename + 1;
      do {
        if (0x102 < uVar5) goto LAB_0010df42;
        uVar5 = uVar5 + 1;
        *pcVar7 = cVar8;
        pcVar7 = pcVar7 + 1;
        cVar8 = *pcVar10;
        pcVar10 = pcVar10 + 1;
      } while (cVar8 != '\0');
    }
    if (uVar5 + 1 < 0x105) {
      *pcVar7 = '\0';
      if (uVar5 + 1 != 0x104) {
        memset(local_258 + uVar5 + 1,0xfd,0x103 - uVar5);
      }
      goto LAB_0010df6c;
    }
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + uVar9 == 0x103) goto LAB_0010df42;
      pcVar10[lVar3] = local_148[lVar3];
      lVar1 = lVar3 + 1;
    } while (local_148[lVar3 + 1] != '\0');
    puVar4 = _mbsdec(local_148,local_148 + lVar3 + 1);
    uVar5 = lVar1 + uVar9;
    pcVar7 = pcVar10 + lVar1;
    if ((*puVar4 == '/') || (*puVar4 == '\\')) goto LAB_0010df0c;
    if (lVar1 + uVar9 != 0x103) {
      pcVar10[lVar1] = '\\';
      uVar5 = lVar1 + uVar9 + 1;
      pcVar7 = pcVar10 + lVar1 + 1;
      goto LAB_0010df0c;
    }
  }
LAB_0010df42:
  local_258[0] = '\0';
  memset(local_258 + 1,0xfd,0x103);
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
LAB_0010df6c:
  __n = strlen(local_258);
  if (__n < buffer_size) {
    memcpy(path,local_258,__n);
  }
  else {
    __n = 0;
  }
  path[__n] = '\0';
  return;
}

Assistant:

void GetBinaryPathWithFileNameA(char *path, const size_t buffer_size, const char* filename)
{
    char fullpath[_MAX_PATH];
    char drive[_MAX_DRIVE];
    char dir[_MAX_DIR];

    char modulename[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(modulename, _MAX_PATH);
    _splitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _makepath_s(fullpath, drive, dir, filename, nullptr);

    size_t len = strlen(fullpath);
    if (len < buffer_size)
    {
        memcpy(path, fullpath, len * sizeof(char));
    }
    else
    {
        len = 0;
    }
    path[len] = char(0);
}